

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

bool PackedVertexPNTCUV::is_near(vec4 *vecA,vec4 *vecB)

{
  if (((ABS((vecA->field_0).field_0.x - (vecB->field_0).field_0.x) < 0.00390625) &&
      (ABS((vecA->field_0).field_0.y - (vecB->field_0).field_0.y) < 0.00390625)) &&
     (ABS((vecA->field_0).field_0.z - (vecB->field_0).field_0.z) < 0.00390625)) {
    return ABS((vecA->field_0).field_0.w - (vecB->field_0).field_0.w) < 0.00390625;
  }
  return false;
}

Assistant:

static bool is_near(const glm::vec4 & vecA, const glm::vec4 & vecB)
  {
    const float epsilon = 1 / 256.f;
    return is_near(vecA[0], vecB[0], epsilon) and is_near(vecA[1], vecB[1], epsilon) and is_near(vecA[2], vecB[2], epsilon) and is_near(vecA[3], vecB[3], epsilon);
  }